

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BothInclusiveBetweenOperator,true,true,true>
                (uchar *adata,uchar *bdata,uchar *cdata,SelectionVector *result_sel,idx_t count,
                SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  idx_t i;
  ulong uVar13;
  
  psVar4 = asel->sel_vector;
  psVar5 = bsel->sel_vector;
  psVar6 = csel->sel_vector;
  lVar11 = 0;
  iVar7 = 0;
  for (uVar13 = 0; count != uVar13; uVar13 = uVar13 + 1) {
    uVar12 = uVar13;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar12 = (ulong)result_sel->sel_vector[uVar13];
    }
    uVar8 = uVar13;
    if (psVar4 != (sel_t *)0x0) {
      uVar8 = (ulong)psVar4[uVar13];
    }
    uVar9 = uVar13;
    if (psVar5 != (sel_t *)0x0) {
      uVar9 = (ulong)psVar5[uVar13];
    }
    uVar10 = uVar13;
    if (psVar6 != (sel_t *)0x0) {
      uVar10 = (ulong)psVar6[uVar13];
    }
    bVar1 = adata[uVar8];
    bVar2 = bdata[uVar9];
    bVar3 = cdata[uVar10];
    true_sel->sel_vector[iVar7] = (sel_t)uVar12;
    iVar7 = iVar7 + (bVar1 <= bVar3 && bVar2 <= bVar1);
    false_sel->sel_vector[lVar11] = (sel_t)uVar12;
    lVar11 = lVar11 + (ulong)(bVar1 > bVar3 || bVar2 > bVar1);
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}